

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogLikelihoodsMulti
          (BeagleCPUImpl<float,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *scalingFactorsIndices,int count,double *outSumLogLikelihood)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  vector<float,_std::allocator<float>_> *this_00;
  long lVar10;
  long lVar11;
  reference pvVar12;
  reference pvVar13;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 extraout_var [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int *in_stack_00000008;
  int in_stack_00000010;
  double *in_stack_00000018;
  int i_4;
  int i_3;
  float tmpSum;
  float tmpScaleFactor;
  int j_1;
  float *cumulativeScaleFactors;
  int cumulativeScalingFactorIndex;
  int i_2;
  float sumOverI;
  int k_2;
  int u;
  float *transMatrixPtr;
  int j;
  double sumOverJB;
  double sumOverJA;
  int i_1;
  float *partialsChildPtr;
  int w_1;
  int k_1;
  float weight_1;
  int u_2;
  int l_1;
  int stateCountModFour;
  int v_1;
  float *partialsChild;
  int i;
  int w;
  int stateChild;
  int k;
  float weight;
  int u_1;
  int l;
  int v;
  int *statesChild;
  int childIndex;
  float *freqs;
  float *wt;
  float *transMatrix;
  float *partialsParent;
  int subsetIndex;
  int returnCode;
  vector<float,_std::allocator<float>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  int in_stack_fffffffffffffe60;
  value_type in_stack_fffffffffffffe64;
  value_type vVar22;
  undefined4 in_stack_fffffffffffffe68;
  value_type vVar23;
  undefined4 in_stack_fffffffffffffe6c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe70;
  int local_164;
  int local_160;
  int local_154;
  int local_140;
  float local_13c;
  int local_138;
  int local_134;
  int local_124;
  double local_120;
  double local_118;
  int local_10c;
  int local_fc;
  int local_f8;
  int local_f0;
  int local_ec;
  int local_e4;
  int local_d8;
  int local_d4;
  int local_cc;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_84;
  int local_80;
  vector<float,_std::allocator<float>_> local_78 [2];
  vector<int,_std::allocator<int>_> local_48;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<int>::allocator((allocator<int> *)0x1a0266);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffe70,CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
             ,(allocator_type *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  std::allocator<int>::~allocator((allocator<int> *)0x1a028c);
  this_00 = (vector<float,_std::allocator<float>_> *)(long)*(int *)(in_RDI + 0x14);
  std::allocator<float>::allocator((allocator<float> *)0x1a02ac);
  std::vector<float,_std::allocator<float>_>::vector
            (this_00,CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (allocator_type *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  std::allocator<float>::~allocator((allocator<float> *)0x1a02d2);
  local_80 = 0;
  for (local_84 = 0; local_84 < in_stack_00000010; local_84 = local_84 + 1) {
    lVar3 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)*(int *)(local_10 + (long)local_84 * 4) * 8);
    lVar4 = *(long *)(*(long *)(in_RDI + 0xd0) + (long)*(int *)(local_20 + (long)local_84 * 4) * 8);
    lVar5 = *(long *)(*(long *)(in_RDI + 0x98) + (long)*(int *)(local_28 + (long)local_84 * 4) * 8);
    lVar6 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)*(int *)(local_30 + (long)local_84 * 4) * 8);
    iVar2 = *(int *)(local_18 + (long)local_84 * 4);
    memset(*(void **)(in_RDI + 0xd8),0,
           (long)(*(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24)) << 2);
    if ((iVar2 < *(int *)(in_RDI + 0x10)) &&
       (*(long *)(*(long *)(in_RDI + 0xb0) + (long)iVar2 * 8) != 0)) {
      lVar7 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)iVar2 * 8);
      local_bc = 0;
      for (local_c0 = 0; local_c0 < *(int *)(in_RDI + 0x34); local_c0 = local_c0 + 1) {
        local_c4 = 0;
        uVar1 = *(uint *)(lVar5 + (long)local_c0 * 4);
        for (local_cc = 0; local_cc < *(int *)(in_RDI + 0x14); local_cc = local_cc + 1) {
          iVar2 = *(int *)(lVar7 + (long)local_cc * 4);
          local_d4 = local_c0 * *(int *)(in_RDI + 0x40);
          for (local_d8 = 0; local_d8 < *(int *)(in_RDI + 0x24); local_d8 = local_d8 + 1) {
            fVar8 = *(float *)(lVar4 + (long)(local_d4 + iVar2) * 4) *
                    *(float *)(lVar3 + (long)(local_bc + local_d8) * 4);
            in_ZMM1 = ZEXT464((uint)fVar8);
            auVar15 = vfmadd213ss_fma(ZEXT416(uVar1),ZEXT416((uint)fVar8),
                                      ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) +
                                                       (long)local_c4 * 4)));
            *(int *)(*(long *)(in_RDI + 0xd8) + (long)local_c4 * 4) = auVar15._0_4_;
            local_c4 = local_c4 + 1;
            local_d4 = *(int *)(in_RDI + 0x28) + local_d4;
          }
          local_bc = *(int *)(in_RDI + 0x2c) + local_bc;
        }
      }
    }
    else {
      lVar7 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)iVar2 * 8);
      local_e4 = 0;
      iVar2 = *(int *)(in_RDI + 0x24);
      for (local_ec = 0; local_ec < *(int *)(in_RDI + 0x34); local_ec = local_ec + 1) {
        local_f0 = 0;
        fVar8 = *(float *)(lVar5 + (long)local_ec * 4);
        for (local_f8 = 0; local_f8 < *(int *)(in_RDI + 0x14); local_f8 = local_f8 + 1) {
          local_fc = local_ec * *(int *)(in_RDI + 0x40);
          lVar10 = lVar7 + (long)local_e4 * 4;
          for (local_10c = 0; local_10c < *(int *)(in_RDI + 0x24); local_10c = local_10c + 1) {
            local_118 = 0.0;
            local_120 = 0.0;
            lVar11 = lVar4 + (long)local_fc * 4;
            for (local_124 = 0; local_124 < iVar2 / 4 << 2; local_124 = local_124 + 4) {
              local_118 = (double)(*(float *)(lVar11 + (long)(local_124 + 2) * 4) *
                                  *(float *)(lVar10 + (long)(local_124 + 2) * 4)) +
                          (double)(*(float *)(lVar11 + (long)local_124 * 4) *
                                  *(float *)(lVar10 + (long)local_124 * 4)) + local_118;
              fVar9 = *(float *)(lVar11 + (long)(local_124 + 3) * 4) *
                      *(float *)(lVar10 + (long)(local_124 + 3) * 4);
              in_ZMM1 = ZEXT464((uint)fVar9);
              local_120 = (double)fVar9 +
                          (double)(*(float *)(lVar11 + (long)(local_124 + 1) * 4) *
                                  *(float *)(lVar10 + (long)(local_124 + 1) * 4)) + local_120;
            }
            for (; local_124 < *(int *)(in_RDI + 0x24); local_124 = local_124 + 1) {
              fVar9 = *(float *)(lVar11 + (long)local_124 * 4) *
                      *(float *)(lVar10 + (long)local_124 * 4);
              in_ZMM1 = ZEXT464((uint)fVar9);
              local_118 = (double)fVar9 + local_118;
            }
            auVar18._8_8_ = in_ZMM1._8_8_;
            auVar18._0_8_ = (double)fVar8;
            auVar20._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0xd8) + (long)local_f0 * 4);
            auVar20._8_8_ = 0;
            auVar15._8_8_ = 0;
            auVar15._0_8_ =
                 (local_118 + local_120) *
                 (double)*(float *)(lVar3 + (long)(local_e4 + local_10c) * 4);
            auVar15 = vfmadd213sd_fma(auVar18,auVar15,auVar20);
            in_ZMM1 = ZEXT1664(auVar15);
            *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_f0 * 4) = (float)auVar15._0_8_;
            local_f0 = local_f0 + 1;
            local_fc = *(int *)(in_RDI + 0x24) + local_fc + 1;
          }
          local_e4 = *(int *)(in_RDI + 0x2c) + local_e4;
        }
      }
    }
    local_134 = 0;
    for (local_138 = 0; local_138 < *(int *)(in_RDI + 0x14); local_138 = local_138 + 1) {
      local_13c = 0.0;
      for (local_140 = 0; local_140 < *(int *)(in_RDI + 0x24); local_140 = local_140 + 1) {
        uVar1 = *(uint *)(lVar6 + (long)local_140 * 4);
        in_ZMM1 = ZEXT464(uVar1);
        auVar15 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)local_134 * 4))
                                  ,ZEXT416(uVar1),ZEXT416((uint)local_13c));
        local_13c = auVar15._0_4_;
        local_134 = local_134 + 1;
      }
      if (*in_stack_00000008 != -1) {
        lVar3 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)in_stack_00000008[local_84] * 8);
        if (local_84 == 0) {
          pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_138);
          *pvVar12 = 0;
          vVar22 = *(value_type *)(lVar3 + (long)local_138 * 4);
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](local_78,(long)local_138)
          ;
          *pvVar13 = vVar22;
          for (local_154 = 1; local_154 < in_stack_00000010; local_154 = local_154 + 1) {
            vVar22 = *(value_type *)
                      (*(long *)(*(long *)(in_RDI + 0xb8) + (long)in_stack_00000008[local_154] * 8)
                      + (long)local_138 * 4);
            vVar23 = vVar22;
            pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                (local_78,(long)local_138);
            if (*pvVar13 < vVar23) {
              in_stack_fffffffffffffe60 = local_154;
              pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&local_48,(long)local_138);
              *pvVar12 = in_stack_fffffffffffffe60;
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  (local_78,(long)local_138);
              *pvVar13 = vVar22;
              in_stack_fffffffffffffe64 = vVar22;
            }
          }
        }
        pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_138);
        if (local_84 != *pvVar12) {
          fVar8 = *(float *)(lVar3 + (long)local_138 * 4);
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](local_78,(long)local_138)
          ;
          dVar14 = exp((double)(fVar8 - *pvVar13));
          in_ZMM1 = ZEXT864((ulong)((double)local_13c * dVar14));
          local_13c = (float)((double)local_13c * dVar14);
        }
      }
      if (local_84 == 0) {
        *(float *)(*(long *)(in_RDI + 0x108) + (long)local_138 * 4) = local_13c;
      }
      else if (local_84 == in_stack_00000010 + -1) {
        auVar17._0_8_ =
             log((double)(*(float *)(*(long *)(in_RDI + 0x108) + (long)local_138 * 4) + local_13c));
        auVar17._8_56_ = extraout_var;
        in_ZMM1 = ZEXT1664(auVar17._0_16_);
        *(float *)(*(long *)(in_RDI + 0x108) + (long)local_138 * 4) = (float)auVar17._0_8_;
      }
      else {
        *(float *)(*(long *)(in_RDI + 0x108) + (long)local_138 * 4) =
             local_13c + *(float *)(*(long *)(in_RDI + 0x108) + (long)local_138 * 4);
      }
    }
  }
  if (*in_stack_00000008 != -1) {
    for (local_160 = 0; local_160 < *(int *)(in_RDI + 0x14); local_160 = local_160 + 1) {
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](local_78,(long)local_160);
      *(float *)(*(long *)(in_RDI + 0x108) + (long)local_160 * 4) =
           *pvVar13 + *(float *)(*(long *)(in_RDI + 0x108) + (long)local_160 * 4);
    }
  }
  auVar17 = ZEXT1664((undefined1  [16])0x0);
  *in_stack_00000018 = 0.0;
  for (local_164 = 0; local_164 < *(int *)(in_RDI + 0x14); local_164 = local_164 + 1) {
    auVar19._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0x108) + (long)local_164 * 4);
    auVar19._8_8_ = auVar17._8_8_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x78) + (long)local_164 * 8);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = *in_stack_00000018;
    auVar15 = vfmadd213sd_fma(auVar16,auVar19,auVar21);
    auVar17 = ZEXT1664(auVar15);
    *in_stack_00000018 = auVar15._0_8_;
  }
  if ((*in_stack_00000018 != *in_stack_00000018) ||
     (NAN(*in_stack_00000018) || NAN(*in_stack_00000018))) {
    local_80 = -8;
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  return local_80;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsMulti(const int* parentBufferIndices,
                                                                   const int* childBufferIndices,
                                                                   const int* probabilityIndices,
                                                                   const int* categoryWeightsIndices,
                                                                   const int* stateFrequenciesIndices,
                                                                   const int* scalingFactorsIndices,
                                                                   int count,
                                                                   double* outSumLogLikelihood) {

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    int returnCode = BEAGLE_SUCCESS;

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const REALTYPE* partialsParent = gPartials[parentBufferIndices[subsetIndex]];
        const REALTYPE* transMatrix = gTransitionMatrices[probabilityIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        int childIndex = childBufferIndices[subsetIndex];

        memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = 0; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = 0; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = 0; k < kPatternCount; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
            }
        } else {
            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = 0;
            int stateCountModFour = (kStateCount / 4) * 4;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = 0;
                const REALTYPE weight = wt[l];
                for(int k = 0; k < kPatternCount; k++) {
                    int w = l * kMatrixSize;
                    const REALTYPE* partialsChildPtr = &partialsChild[v];
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJA = 0.0, sumOverJB = 0.0;
                        int j = 0;
                        const REALTYPE* transMatrixPtr = &transMatrix[w];
                        for (; j < stateCountModFour; j += 4) {
                            sumOverJA += transMatrixPtr[j + 0] * partialsChildPtr[j + 0];
                            sumOverJB += transMatrixPtr[j + 1] * partialsChildPtr[j + 1];
                            sumOverJA += transMatrixPtr[j + 2] * partialsChildPtr[j + 2];
                            sumOverJB += transMatrixPtr[j + 3] * partialsChildPtr[j + 3];

                        }
                        for (; j < kStateCount; j++) {
                            sumOverJA += transMatrixPtr[j] * partialsChildPtr[j];
                        }
//                        for(int j = 0; j < kStateCount; j++) {
//                            sumOverJ += transMatrix[w] * partialsChild[v + j];
//                            w++;
//                        }
                        integrationTmp[u] += (sumOverJA + sumOverJB) * partialsParent[v + i] * weight;
                        u++;

                        w += kStateCount;

                        // increment for the extra column at the end
                        w += T_PAD;
                    }
                    v += kPartialsPaddedStateCount;
                }
            }

        }
        int u = 0;
        for(int k = 0; k < kPatternCount; k++) {
            REALTYPE sumOverI = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                u++;
            }

            if (scalingFactorsIndices[0] != BEAGLE_OP_NONE) {
                int cumulativeScalingFactorIndex;
                cumulativeScalingFactorIndex = scalingFactorsIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        tmpScaleFactor = gScaleBuffers[scalingFactorsIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sumOverI *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }



            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sumOverI;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sumOverI;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sumOverI;
            }

        }

    }

    if (scalingFactorsIndices[0] != BEAGLE_OP_NONE) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }


    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}